

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O3

void divsufsortxx::substring::
     merge<std::stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>>,char*,bitmap::BitmapArray<long>::iterator,long*>
               (stack<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>_>
                *stack,char *T,iterator PA,iterator first,iterator middle,iterator last,long *buf,
               value_type bufsize,value_type depth)

{
  iterator *piVar1;
  iterator middle_00;
  iterator middle_01;
  iterator last_00;
  iterator last_01;
  int iVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  ulong uVar6;
  int extraout_var;
  undefined4 extraout_var_00;
  int extraout_var_01;
  undefined4 extraout_var_02;
  int extraout_var_03;
  int extraout_var_04;
  undefined4 extraout_var_05;
  int extraout_var_06;
  int extraout_var_07;
  int extraout_var_08;
  undefined4 extraout_var_09;
  undefined4 extraout_var_10;
  undefined4 extraout_var_11;
  int extraout_var_12;
  int extraout_var_13;
  undefined4 extraout_var_14;
  undefined4 extraout_var_15;
  undefined4 extraout_var_16;
  int extraout_var_17;
  int extraout_var_18;
  undefined4 extraout_var_19;
  undefined4 extraout_var_20;
  undefined4 extraout_var_21;
  int extraout_var_22;
  int extraout_var_23;
  undefined4 extraout_var_24;
  undefined4 extraout_var_25;
  undefined4 extraout_var_26;
  int extraout_var_27;
  int extraout_var_28;
  undefined4 extraout_var_29;
  undefined4 extraout_var_30;
  undefined4 extraout_var_31;
  _Elt_pointer psVar7;
  pos_type pVar8;
  BitmapArray<long> *pBVar9;
  long lVar10;
  pos_type pVar11;
  ulong uVar12;
  pos_type pVar13;
  pos_type pVar14;
  BitmapArray<long> *pBVar15;
  long lVar16;
  ulong uVar17;
  iterator last1;
  iterator first2;
  iterator first_00;
  iterator first_01;
  iterator p1;
  iterator p1_00;
  iterator p1_01;
  iterator p1_02;
  iterator p1_03;
  iterator p1_04;
  iterator p2;
  iterator p2_00;
  iterator p2_01;
  iterator p2_02;
  iterator p2_03;
  iterator p2_04;
  iterator first1;
  pos_type local_b0;
  stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>
  local_80;
  ulong local_48;
  ulong local_40;
  ulong local_38;
  
  pVar8 = PA.pos_;
  pBVar9 = PA.array_;
  local_b0 = last.pos_;
  uVar5 = 0;
  pVar13 = first.pos_;
  pBVar15 = first.array_;
LAB_0010a9c4:
  do {
    uVar6 = local_b0 - middle.pos_;
    if (bufsize < (long)uVar6) {
      uVar12 = middle.pos_ - pVar13;
      if ((long)uVar12 <= bufsize) {
        if (pVar13 < middle.pos_) {
          middle_01.pos_ = middle.pos_;
          middle_01.array_ = middle.array_;
          last_01.pos_ = last.pos_;
          last_01.array_ = last.array_;
          first_01.pos_ = pVar13;
          first_01.array_ = pBVar15;
          merge_forward<char*,bitmap::BitmapArray<long>::iterator,long*>
                    (T,PA,buf,first_01,middle_01,last_01,depth);
        }
        goto LAB_0010af8b;
      }
      uVar17 = uVar12;
      if ((long)uVar6 < (long)uVar12) {
        uVar17 = uVar6;
      }
      local_48 = uVar12;
      local_40 = uVar6;
      if (0 < (long)uVar17) {
        lVar16 = 0;
        do {
          uVar6 = uVar17 >> 1;
          lVar10 = uVar6 + lVar16 + middle.pos_;
          local_38 = uVar17;
          (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,lVar10);
          iVar2 = (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,lVar10);
          lVar10 = ~(uVar6 + lVar16) + middle.pos_;
          (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,lVar10);
          iVar3 = (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,lVar10);
          p1.pos_ = ((long)extraout_var >> 0x1f ^ CONCAT44(extraout_var_00,iVar2)) + pVar8;
          p1.array_ = pBVar9;
          p2.pos_ = ((long)extraout_var_01 >> 0x1f ^ CONCAT44(extraout_var_02,iVar3)) + pVar8;
          p2.array_ = pBVar9;
          iVar2 = compare<char*,bitmap::BitmapArray<long>::iterator>(T,p1,p2,depth);
          if (iVar2 < 0) {
            uVar4 = ~(uint)local_38 & 1;
            lVar16 = uVar6 + lVar16 + 1;
          }
          else {
            uVar4 = 0;
          }
          uVar17 = uVar6 - uVar4;
        } while (uVar17 != 0 && uVar4 <= uVar6);
        if (0 < lVar16) {
          first1.pos_ = middle.pos_ - lVar16;
          last1.pos_ = middle.pos_;
          last1.array_ = middle.array_;
          first2.pos_ = middle.pos_;
          first2.array_ = middle.array_;
          first1.array_ = middle.array_;
          helper::vecswap<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator>
                    (first1,last1,first2);
          uVar17 = lVar16 + middle.pos_;
          uVar4 = 0;
          uVar6 = local_40;
          uVar12 = local_48;
          pVar11 = middle.pos_;
          pVar14 = middle.pos_;
          if (uVar17 < local_b0) {
            (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,uVar17);
            if (extraout_var_03 < 0) {
              pVar11 = middle.pos_ + 1;
              do {
                (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,pVar11 - 2);
                pVar11 = pVar11 - 1;
              } while (extraout_var_04 < 0);
              iVar2 = (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,uVar17);
              (*((middle.array_)->super_Bitmap)._vptr_Bitmap[4])
                        (middle.array_,uVar17,~CONCAT44(extraout_var_05,iVar2));
            }
            pVar14 = middle.pos_ - 1;
            do {
              pVar14 = pVar14 + 1;
              (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,pVar14);
            } while (extraout_var_06 < 0);
            uVar12 = pVar11 - pVar13;
            uVar6 = local_b0 - pVar14;
            uVar4 = 1;
          }
          if ((long)uVar6 < (long)uVar12) {
            uVar4 = uVar4 << (middle.pos_ == pVar11 && pVar14 == middle.pos_);
            local_80.m_d = uVar4 & 0xfffffffe | uVar5 & 1;
            local_80.m_b.array_ = middle.array_;
            local_80.m_c.array_ = middle.array_;
            psVar7 = (stack->c).
                     super__Deque_base<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_cur;
            local_80.m_a.array_ = pBVar15;
            local_80.m_a.pos_ = pVar13;
            local_80.m_b.pos_ = first1.pos_;
            local_80.m_c.pos_ = pVar11;
            if (psVar7 == (stack->c).
                          super__Deque_base<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
              std::
              deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
              ::
              _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>
                        ((deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
                          *)stack,&local_80);
            }
            else {
              *(ulong *)&psVar7->m_d = CONCAT44(local_80._52_4_,local_80.m_d);
              (psVar7->m_c).array_ = middle.array_;
              (psVar7->m_c).pos_ = pVar11;
              (psVar7->m_b).array_ = middle.array_;
              (psVar7->m_b).pos_ = first1.pos_;
              (psVar7->m_a).array_ = pBVar15;
              (psVar7->m_a).pos_ = pVar13;
              piVar1 = &(stack->c).
                        super__Deque_base<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish;
              piVar1->_M_cur = piVar1->_M_cur + 1;
            }
            uVar5 = uVar5 & 2 | uVar4 & 1;
            pVar13 = pVar14;
            pBVar15 = middle.array_;
            middle.pos_ = uVar17;
          }
          else {
            local_80.m_c.array_ = last.array_;
            local_80.m_c.pos_ = last.pos_;
            local_80.m_d = uVar4 | uVar5 & 2;
            local_80.m_a.array_ = middle.array_;
            local_80.m_b.array_ = middle.array_;
            psVar7 = (stack->c).
                     super__Deque_base<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>
                     ._M_impl.super__Deque_impl_data._M_finish._M_cur;
            local_80.m_a.pos_ = pVar14;
            local_80.m_b.pos_ = uVar17;
            if (psVar7 == (stack->c).
                          super__Deque_base<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>
                          ._M_impl.super__Deque_impl_data._M_finish._M_last + -1) {
              std::
              deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
              ::
              _M_push_back_aux<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>
                        ((deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>,std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,bitmap::BitmapArray<long>::iterator,int>>>
                          *)stack,&local_80);
            }
            else {
              *(ulong *)&psVar7->m_d = CONCAT44(local_80._52_4_,local_80.m_d);
              (psVar7->m_c).array_ = last.array_;
              (psVar7->m_c).pos_ = last.pos_;
              (psVar7->m_b).array_ = middle.array_;
              (psVar7->m_b).pos_ = uVar17;
              (psVar7->m_a).array_ = middle.array_;
              (psVar7->m_a).pos_ = pVar14;
              piVar1 = &(stack->c).
                        super__Deque_base<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>
                        ._M_impl.super__Deque_impl_data._M_finish;
              piVar1->_M_cur = piVar1->_M_cur + 1;
            }
            uVar5 = uVar5 & 1;
            middle.pos_ = first1.pos_;
            last.array_ = middle.array_;
            last.pos_ = pVar11;
            local_b0 = pVar11;
          }
          goto LAB_0010a9c4;
        }
      }
      if (((uVar5 & 1) != 0) &&
         ((*(pBVar15->super_Bitmap)._vptr_Bitmap[5])(pBVar15,pVar13), -1 < extraout_var_07)) {
        (*(pBVar15->super_Bitmap)._vptr_Bitmap[5])(pBVar15,pVar13 - 1);
        iVar2 = (*(pBVar15->super_Bitmap)._vptr_Bitmap[5])(pBVar15,pVar13 - 1);
        iVar3 = (*(pBVar15->super_Bitmap)._vptr_Bitmap[5])(pBVar15,pVar13);
        p1_00.pos_ = ((long)extraout_var_08 >> 0x1f ^ CONCAT44(extraout_var_09,iVar2)) + pVar8;
        p1_00.array_ = pBVar9;
        p2_00.pos_ = CONCAT44(extraout_var_10,iVar3) + pVar8;
        p2_00.array_ = pBVar9;
        iVar2 = compare<char*,bitmap::BitmapArray<long>::iterator>(T,p1_00,p2_00,depth);
        if (iVar2 == 0) {
          iVar2 = (*(pBVar15->super_Bitmap)._vptr_Bitmap[5])(pBVar15,pVar13);
          (*(pBVar15->super_Bitmap)._vptr_Bitmap[4])
                    (pBVar15,pVar13,~CONCAT44(extraout_var_11,iVar2));
        }
      }
      (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,middle.pos_);
      if (-1 < extraout_var_12) {
        (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,middle.pos_ - 1);
        iVar2 = (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,middle.pos_ - 1);
        iVar3 = (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,middle.pos_);
        p1_01.pos_ = ((long)extraout_var_13 >> 0x1f ^ CONCAT44(extraout_var_14,iVar2)) + pVar8;
        p1_01.array_ = pBVar9;
        p2_01.pos_ = CONCAT44(extraout_var_15,iVar3) + pVar8;
        p2_01.array_ = pBVar9;
        iVar2 = compare<char*,bitmap::BitmapArray<long>::iterator>(T,p1_01,p2_01,depth);
        if (iVar2 == 0) {
          iVar2 = (*((middle.array_)->super_Bitmap)._vptr_Bitmap[5])(middle.array_,middle.pos_);
          (*((middle.array_)->super_Bitmap)._vptr_Bitmap[4])
                    (middle.array_,middle.pos_,~CONCAT44(extraout_var_16,iVar2));
        }
      }
      if (((uVar5 & 2) != 0) &&
         ((*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,last.pos_),
         -1 < extraout_var_17)) {
        (*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,last.pos_ - 1);
        iVar2 = (*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,last.pos_ - 1);
        iVar3 = (*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,last.pos_);
        p1_02.pos_ = ((long)extraout_var_18 >> 0x1f ^ CONCAT44(extraout_var_19,iVar2)) + pVar8;
        p1_02.array_ = pBVar9;
        p2_02.pos_ = CONCAT44(extraout_var_20,iVar3) + pVar8;
        p2_02.array_ = pBVar9;
        iVar2 = compare<char*,bitmap::BitmapArray<long>::iterator>(T,p1_02,p2_02,depth);
        if (iVar2 == 0) {
          iVar2 = (*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,last.pos_);
          (*((last.array_)->super_Bitmap)._vptr_Bitmap[4])
                    (last.array_,last.pos_,~CONCAT44(extraout_var_21,iVar2));
        }
      }
      psVar7 = (stack->c).
               super__Deque_base<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (psVar7 == (stack->c).
                    super__Deque_base<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur) {
        return;
      }
    }
    else {
      if ((pVar13 < middle.pos_) && (middle.pos_ < local_b0)) {
        middle_00.pos_ = middle.pos_;
        middle_00.array_ = middle.array_;
        last_00.pos_ = last.pos_;
        last_00.array_ = last.array_;
        first_00.pos_ = pVar13;
        first_00.array_ = pBVar15;
        merge_backward<char*,bitmap::BitmapArray<long>::iterator,long*>
                  (T,PA,buf,first_00,middle_00,last_00,depth);
      }
LAB_0010af8b:
      if (((uVar5 & 1) != 0) &&
         ((*(pBVar15->super_Bitmap)._vptr_Bitmap[5])(pBVar15,pVar13), -1 < extraout_var_22)) {
        (*(pBVar15->super_Bitmap)._vptr_Bitmap[5])(pBVar15,pVar13 - 1);
        iVar2 = (*(pBVar15->super_Bitmap)._vptr_Bitmap[5])(pBVar15,pVar13 - 1);
        iVar3 = (*(pBVar15->super_Bitmap)._vptr_Bitmap[5])(pBVar15,pVar13);
        p1_03.pos_ = ((long)extraout_var_23 >> 0x1f ^ CONCAT44(extraout_var_24,iVar2)) + pVar8;
        p1_03.array_ = pBVar9;
        p2_03.pos_ = CONCAT44(extraout_var_25,iVar3) + pVar8;
        p2_03.array_ = pBVar9;
        iVar2 = compare<char*,bitmap::BitmapArray<long>::iterator>(T,p1_03,p2_03,depth);
        if (iVar2 == 0) {
          iVar2 = (*(pBVar15->super_Bitmap)._vptr_Bitmap[5])(pBVar15,pVar13);
          (*(pBVar15->super_Bitmap)._vptr_Bitmap[4])
                    (pBVar15,pVar13,~CONCAT44(extraout_var_26,iVar2));
        }
      }
      if (((uVar5 & 2) != 0) &&
         ((*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,last.pos_),
         -1 < extraout_var_27)) {
        (*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,last.pos_ - 1);
        iVar2 = (*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,last.pos_ - 1);
        iVar3 = (*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,last.pos_);
        p1_04.pos_ = ((long)extraout_var_28 >> 0x1f ^ CONCAT44(extraout_var_29,iVar2)) + pVar8;
        p1_04.array_ = pBVar9;
        p2_04.pos_ = CONCAT44(extraout_var_30,iVar3) + pVar8;
        p2_04.array_ = pBVar9;
        iVar2 = compare<char*,bitmap::BitmapArray<long>::iterator>(T,p1_04,p2_04,depth);
        if (iVar2 == 0) {
          iVar2 = (*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,last.pos_);
          (*((last.array_)->super_Bitmap)._vptr_Bitmap[4])
                    (last.array_,last.pos_,~CONCAT44(extraout_var_31,iVar2));
        }
      }
      psVar7 = (stack->c).
               super__Deque_base<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_cur;
      if (psVar7 == (stack->c).
                    super__Deque_base<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>
                    ._M_impl.super__Deque_impl_data._M_start._M_cur) {
        return;
      }
    }
    if (psVar7 == (stack->c).
                  super__Deque_base<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_first) {
      psVar7 = (stack->c).
               super__Deque_base<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 9;
    }
    pBVar15 = psVar7[-1].m_a.array_;
    pVar13 = psVar7[-1].m_a.pos_;
    middle.array_ = psVar7[-1].m_b.array_;
    middle.pos_ = psVar7[-1].m_b.pos_;
    last.array_ = psVar7[-1].m_c.array_;
    last.pos_ = psVar7[-1].m_c.pos_;
    uVar5 = psVar7[-1].m_d;
    std::
    deque<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>,_std::allocator<divsufsortxx::helper::stackinfo4<bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_bitmap::BitmapArray<long>::iterator,_int>_>_>
    ::pop_back(&stack->c);
    local_b0 = last.pos_;
  } while( true );
}

Assistant:

void merge(stack_type &stack, const StringIterator_type T,
           const SAIterator_type PA, SAIterator_type first,
           SAIterator_type middle, SAIterator_type last, BufIterator_type buf,
           typename std::iterator_traits<SAIterator_type>::value_type bufsize,
           typename std::iterator_traits<SAIterator_type>::value_type depth) {
  typedef typename std::iterator_traits<SAIterator_type>::difference_type difference_type;
  typedef typename stack_type::value_type stackinfo_type;
#define GETIDX(a) ((0 <= (a)) ? (a) : (~(a)))
#define MERGE_CHECK(a)\
  {\
    if((0 <= *(a)) &&\
       (compare(T, PA + GETIDX(*((a) - 1)), PA + *(a), depth) == 0)) {\
      *(a) = ~*(a);\
    }\
  }

  SAIterator_type i, j;
  difference_type m, len, half;
  int check, next;

  for (check = 0;;) {

    if ((last - middle) <= bufsize) {
      if ((first < middle) && (middle < last)) {
        merge_backward(T, PA, buf, first, middle, last, depth);
      }
      if (check & 1) {
        MERGE_CHECK(first);
      }
      if (check & 2) {
        MERGE_CHECK(last);
      }
      STACK_POP4(first, middle, last, check);
      continue;
    }

    if ((middle - first) <= bufsize) {
      if (first < middle) {
        merge_forward(T, PA, buf, first, middle, last, depth);
      }
      if (check & 1) {
        MERGE_CHECK(first);
      }
      if (check & 2) {
        MERGE_CHECK(last);
      }
      STACK_POP4(first, middle, last, check);
      continue;
    }

    for (m = 0, len = std::min(middle - first, last - middle), half = len >> 1;
        0 < len; len = half, half >>= 1) {
      if (compare(T, PA + GETIDX(*(middle + m + half)),
                  PA + GETIDX(*(middle - m - half - 1)), depth) < 0) {
        m += half + 1;
        half -= ((len & 1) == 0);
      }
    }

    if (0 < m) {
      helper::vecswap(middle - m, middle, middle);
      i = j = middle, next = 0;
      if ((middle + m) < last) {
        if (*(middle + m) < 0) {
          for (; *(i - 1) < 0; --i) {
          }
          *(middle + m) = ~*(middle + m);
        }
        for (j = middle; *j < 0; ++j) {
        }
        next = 1;
      }
      if ((i - first) <= (last - j)) {
        STACK_PUSH4(j, middle + m, last, (check & 2) | (next & 1));
        middle -= m, last = i, check = (check & 1);
      } else {
        if ((i == middle) && (middle == j)) {
          next <<= 1;
        }
        STACK_PUSH4(first, middle - m, i, (check & 1) | (next & 2));
        first = j, middle += m, check = (check & 2) | (next & 1);
      }
    } else {
      if (check & 1) {
        MERGE_CHECK(first);
      }
      MERGE_CHECK(middle);
      if (check & 2) {
        MERGE_CHECK(last);
      }
      STACK_POP4(first, middle, last, check);
    }
  }
#undef GETIDX
#undef MERGE_CHECK
}